

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O3

int parseError(char *msg)

{
  int iVar1;
  
  iVar1 = 0;
  info_impl("parseError",0x1ad,"Parse Error: at line %d, position %d, %s",(ulong)(uint)inputLine,
            (ulong)(uint)inputPosition,msg);
  info_impl("parseError",0x1ae,"\"%s\"",inputBuffer);
  if (1 < inputPosition) {
    do {
      fputc(0x2d,_stderr);
      iVar1 = iVar1 + 1;
    } while (iVar1 < inputPosition + -1);
  }
  fwrite("^\n",2,1,_stderr);
  fflush(_stderr);
  exit(1);
}

Assistant:

int parseError(char *msg)
{
    info("Parse Error: at line %d, position %d, %s", inputLine, inputPosition, msg);
    info("\"%s\"", inputBuffer);

    /* print a pointer to the location that we found something wrong. */
    for(int i=0; i < (inputPosition-1); i++) {
        fprintf(stderr, "-");
    }

    fprintf(stderr, "^\n");

    fflush(stderr);

    exit(1);
    return 0;
}